

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O3

void __thiscall ON_SHA1::AccumulateDoubleArray(ON_SHA1 *this,size_t count,double *a)

{
  double *pdVar1;
  double dVar2;
  double v;
  ulong local_28;
  
  if ((a != (double *)0x0 && count != 0) && (0 < (long)count)) {
    pdVar1 = a + count;
    do {
      dVar2 = *a;
      a = a + 1;
      local_28 = ~-(ulong)(dVar2 == 0.0) & (ulong)dVar2;
      Internal_SwapBigEndianUpdate(this,&local_28,8);
    } while (a < pdVar1);
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateDoubleArray(
  size_t count,
  const double* a
)
{
  if (count > 0 && nullptr != a)
  {
    double x, v;
    const double* a1 = a+count;
    while( a < a1)
    {
      x = *a++;
      v = (0.0 == x ? 0.0 : x);
      Internal_SwapBigEndianUpdate( &v, sizeof(v) );
    }
  }
}